

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O3

REF_STATUS ref_migrate_shufflin_cell(REF_NODE ref_node,REF_CELL ref_cell)

{
  size_t __size;
  int *piVar1;
  REF_MPI pRVar2;
  undefined1 auVar3 [16];
  REF_STATUS RVar4;
  uint uVar5;
  uint uVar6;
  REF_INT *send_size;
  long lVar7;
  REF_INT *recv_size;
  void *pvVar8;
  REF_GLOB *pRVar9;
  REF_INT *pRVar10;
  undefined4 *puVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  REF_INT n;
  char *pcVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  REF_INT nunique;
  REF_INT nodes [27];
  REF_INT unique_parts [27];
  REF_INT all_parts [27];
  int local_1dc;
  long local_1d8;
  REF_MPI local_1d0;
  void *local_1c8;
  void *local_1c0;
  undefined1 local_1b8 [16];
  REF_INT *local_1a0;
  REF_GLOB *local_198;
  ulong local_190;
  REF_INT local_188 [28];
  uint local_118 [28];
  REF_INT local_a8 [30];
  
  pRVar2 = ref_node->ref_mpi;
  uVar5 = pRVar2->n;
  if ((long)(int)uVar5 < 2) {
    return 0;
  }
  __size = (long)(int)uVar5 * 4;
  send_size = (REF_INT *)malloc(__size);
  auVar3 = _DAT_001fe2f0;
  if (send_size == (REF_INT *)0x0) {
    pcVar22 = "malloc a_size of REF_INT NULL";
    uVar16 = 0x5dd;
  }
  else {
    lVar7 = (ulong)uVar5 - 1;
    auVar29._8_4_ = (int)lVar7;
    auVar29._0_8_ = lVar7;
    auVar29._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    local_1b8 = auVar29 ^ _DAT_001fe2f0;
    auVar30 = _DAT_001fe2d0;
    auVar27 = _DAT_001fe2e0;
    do {
      auVar29 = auVar27 ^ auVar3;
      iVar17 = local_1b8._4_4_;
      if ((bool)(~(auVar29._4_4_ == iVar17 && local_1b8._0_4_ < auVar29._0_4_ ||
                  iVar17 < auVar29._4_4_) & 1)) {
        *(undefined4 *)((long)send_size + lVar7) = 0;
      }
      if ((auVar29._12_4_ != local_1b8._12_4_ || auVar29._8_4_ <= local_1b8._8_4_) &&
          auVar29._12_4_ <= local_1b8._12_4_) {
        *(undefined4 *)((long)send_size + lVar7 + 4) = 0;
      }
      auVar29 = auVar30 ^ auVar3;
      iVar12 = auVar29._4_4_;
      if (iVar12 <= iVar17 && (iVar12 != iVar17 || auVar29._0_4_ <= local_1b8._0_4_)) {
        *(undefined4 *)((long)send_size + lVar7 + 8) = 0;
        *(undefined4 *)((long)send_size + lVar7 + 0xc) = 0;
      }
      lVar13 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar13 + 4;
      lVar13 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 4;
      auVar30._8_8_ = lVar13 + 4;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar7);
    recv_size = (REF_INT *)malloc(__size);
    auVar3 = _DAT_001fe2f0;
    if (recv_size == (REF_INT *)0x0) {
      pcVar22 = "malloc b_size of REF_INT NULL";
      uVar16 = 0x5de;
    }
    else {
      lVar7 = 0;
      auVar26 = _DAT_001fe2d0;
      auVar28 = _DAT_001fe2e0;
      do {
        auVar30 = auVar28 ^ auVar3;
        if ((bool)(~(auVar30._4_4_ == local_1b8._4_4_ && (int)local_1b8._0_4_ < auVar30._0_4_ ||
                    (int)local_1b8._4_4_ < auVar30._4_4_) & 1)) {
          *(undefined4 *)((long)recv_size + lVar7) = 0;
        }
        if ((auVar30._12_4_ != local_1b8._12_4_ || auVar30._8_4_ <= (int)local_1b8._8_4_) &&
            auVar30._12_4_ <= (int)local_1b8._12_4_) {
          *(undefined4 *)((long)recv_size + lVar7 + 4) = 0;
        }
        auVar30 = auVar26 ^ auVar3;
        iVar17 = auVar30._4_4_;
        if (iVar17 <= (int)local_1b8._4_4_ &&
            (iVar17 != local_1b8._4_4_ || auVar30._0_4_ <= (int)local_1b8._0_4_)) {
          *(undefined4 *)((long)recv_size + lVar7 + 8) = 0;
          *(undefined4 *)((long)recv_size + lVar7 + 0xc) = 0;
        }
        lVar13 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 4;
        auVar28._8_8_ = lVar13 + 4;
        lVar13 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 4;
        auVar26._8_8_ = lVar13 + 4;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar7);
      local_1d0 = pRVar2;
      if (0 < ref_cell->max) {
        iVar17 = 0;
        do {
          RVar4 = ref_cell_nodes(ref_cell,iVar17,local_188);
          if (RVar4 == 0) {
            iVar12 = ref_cell->node_per;
            if (0 < (long)iVar12) {
              pRVar10 = ref_node->part;
              lVar7 = 0;
              do {
                local_a8[lVar7] = pRVar10[local_188[lVar7]];
                lVar7 = lVar7 + 1;
              } while (iVar12 != lVar7);
            }
            uVar5 = ref_sort_unique_int(iVar12,local_a8,&local_1dc,(REF_INT *)local_118);
            if (uVar5 != 0) {
              uVar18 = (ulong)uVar5;
              pcVar22 = "unique";
              uVar16 = 0x5e6;
              goto LAB_001f8dbf;
            }
            if (0 < (long)local_1dc) {
              uVar5 = local_1d0->id;
              lVar7 = 0;
              do {
                if (uVar5 != local_118[lVar7]) {
                  send_size[(int)local_118[lVar7]] = send_size[(int)local_118[lVar7]] + 1;
                }
                lVar7 = lVar7 + 1;
              } while (local_1dc != lVar7);
            }
          }
          iVar17 = iVar17 + 1;
        } while (iVar17 < ref_cell->max);
      }
      pRVar2 = local_1d0;
      uVar5 = ref_mpi_alltoall(local_1d0,send_size,recv_size,1);
      if (uVar5 != 0) {
        uVar18 = (ulong)uVar5;
        pcVar22 = "alltoall sizes";
        uVar16 = 0x5ee;
LAB_001f8dbf:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               uVar16,"ref_migrate_shufflin_cell",uVar18,pcVar22);
        return (REF_STATUS)uVar18;
      }
      uVar5 = pRVar2->n;
      lVar7 = (long)(int)uVar5;
      if (lVar7 < 1) {
        iVar17 = 0;
      }
      else {
        lVar13 = 0;
        iVar17 = 0;
        do {
          iVar17 = iVar17 + send_size[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar7 != lVar13);
      }
      uVar6 = iVar17 * ref_cell->size_per;
      if ((int)uVar6 < 0) {
        pcVar22 = "malloc a_c2n of REF_GLOB negative";
        uVar16 = 0x5f2;
LAB_001f8e59:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               uVar16,"ref_migrate_shufflin_cell",pcVar22);
        return 1;
      }
      local_1d8 = CONCAT44(local_1d8._4_4_,ref_cell->size_per);
      pvVar8 = malloc((ulong)uVar6 * 8);
      if (pvVar8 == (void *)0x0) {
        pcVar22 = "malloc a_c2n of REF_GLOB NULL";
        uVar16 = 0x5f2;
      }
      else {
        local_1c0 = malloc((ulong)uVar6 << 2);
        if (local_1c0 == (void *)0x0) {
          pcVar22 = "malloc a_parts of REF_INT NULL";
          uVar16 = 0x5f3;
        }
        else {
          if ((int)uVar5 < 1) {
            iVar17 = 0;
          }
          else {
            lVar13 = 0;
            iVar17 = 0;
            do {
              iVar17 = iVar17 + recv_size[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar7 != lVar13);
          }
          uVar6 = iVar17 * (int)local_1d8;
          local_1c8 = pvVar8;
          if ((int)uVar6 < 0) {
            pcVar22 = "malloc b_c2n of REF_GLOB negative";
            uVar16 = 0x5f7;
            goto LAB_001f8e59;
          }
          pRVar9 = (REF_GLOB *)malloc((ulong)uVar6 * 8);
          if (pRVar9 == (REF_GLOB *)0x0) {
            pcVar22 = "malloc b_c2n of REF_GLOB NULL";
            uVar16 = 0x5f7;
          }
          else {
            local_198 = pRVar9;
            pRVar10 = (REF_INT *)malloc((ulong)uVar6 << 2);
            if (pRVar10 == (REF_INT *)0x0) {
              pcVar22 = "malloc b_parts of REF_INT NULL";
              uVar16 = 0x5f8;
            }
            else {
              if ((int)uVar5 < 0) {
                pcVar22 = "malloc a_next of REF_INT negative";
                uVar16 = 0x5fa;
                goto LAB_001f8e59;
              }
              local_1a0 = pRVar10;
              puVar11 = (undefined4 *)malloc(lVar7 * 4);
              if (puVar11 != (undefined4 *)0x0) {
                *puVar11 = 0;
                if (1 < uVar5) {
                  lVar13 = 0;
                  iVar12 = 0;
                  do {
                    iVar12 = iVar12 + send_size[lVar13];
                    puVar11[lVar13 + 1] = iVar12;
                    lVar13 = lVar13 + 1;
                  } while (lVar7 + -1 != lVar13);
                }
                local_1b8._0_8_ = puVar11;
                n = (int)local_1d8;
                if (0 < ref_cell->max) {
                  uVar18 = 0;
                  do {
                    local_190 = uVar18;
                    RVar4 = ref_cell_nodes(ref_cell,(REF_INT)uVar18,local_188);
                    if (RVar4 == 0) {
                      iVar12 = ref_cell->node_per;
                      if (0 < (long)iVar12) {
                        pRVar10 = ref_node->part;
                        lVar7 = 0;
                        do {
                          local_a8[lVar7] = pRVar10[local_188[lVar7]];
                          lVar7 = lVar7 + 1;
                        } while (iVar12 != lVar7);
                      }
                      uVar5 = ref_sort_unique_int(iVar12,local_a8,&local_1dc,(REF_INT *)local_118);
                      if (uVar5 != 0) {
                        uVar18 = (ulong)uVar5;
                        pcVar22 = "unique";
                        uVar16 = 0x605;
                        goto LAB_001f8dbf;
                      }
                      lVar7 = (long)local_1dc;
                      if (0 < lVar7) {
                        uVar5 = local_1d0->id;
                        lVar13 = 0;
                        do {
                          lVar19 = (long)(int)local_118[lVar13];
                          if (uVar5 != local_118[lVar13]) {
                            iVar12 = ref_cell->node_per;
                            lVar20 = (long)iVar12;
                            if (0 < lVar20) {
                              pRVar10 = ref_node->part;
                              lVar14 = (long)(*(int *)(local_1b8._0_8_ + lVar19 * 4) *
                                             ref_cell->size_per);
                              lVar23 = 0;
                              do {
                                lVar24 = (long)local_188[lVar23];
                                lVar15 = -1;
                                if (((-1 < lVar24) && (local_188[lVar23] < ref_node->max)) &&
                                   (lVar15 = ref_node->global[lVar24], lVar15 < 0)) {
                                  lVar15 = -1;
                                }
                                *(long *)((long)local_1c8 + lVar23 * 8 + lVar14 * 8) = lVar15;
                                *(REF_INT *)((long)local_1c0 + lVar23 * 4 + lVar14 * 4) =
                                     pRVar10[lVar24];
                                lVar23 = lVar23 + 1;
                              } while (lVar20 != lVar23);
                            }
                            if (ref_cell->last_node_is_an_id == 0) {
                              iVar21 = *(int *)(local_1b8._0_8_ + lVar19 * 4);
                            }
                            else {
                              iVar21 = *(int *)(local_1b8._0_8_ + lVar19 * 4);
                              lVar14 = (long)(ref_cell->size_per * iVar21 + iVar12);
                              *(long *)((long)local_1c8 + lVar14 * 8) = (long)local_188[lVar20];
                              *(undefined4 *)((long)local_1c0 + lVar14 * 4) = 0xffffffff;
                            }
                            *(int *)(local_1b8._0_8_ + lVar19 * 4) = iVar21 + 1;
                          }
                          lVar13 = lVar13 + 1;
                          local_1d8 = lVar7;
                        } while (lVar13 != lVar7);
                      }
                    }
                    uVar5 = (int)local_190 + 1;
                    uVar18 = (ulong)uVar5;
                  } while ((int)uVar5 < ref_cell->max);
                  n = ref_cell->size_per;
                }
                pRVar2 = local_1d0;
                uVar5 = ref_mpi_alltoallv(local_1d0,local_1c8,send_size,local_198,recv_size,n,2);
                if (uVar5 == 0) {
                  uVar5 = ref_mpi_alltoallv(pRVar2,local_1c0,send_size,local_1a0,recv_size,
                                            ref_cell->size_per,1);
                  pRVar9 = local_198;
                  pRVar10 = local_1a0;
                  if (uVar5 == 0) {
                    uVar5 = ref_cell_add_many_global
                                      (ref_cell,ref_node,iVar17,local_198,local_1a0,pRVar2->id);
                    if (uVar5 == 0) {
                      free((void *)local_1b8._0_8_);
                      free(pRVar10);
                      free(pRVar9);
                      free(local_1c0);
                      free(local_1c8);
                      free(recv_size);
                      free(send_size);
                      if (ref_cell->max < 1) {
                        return 0;
                      }
                      iVar17 = 0;
                      do {
                        RVar4 = ref_cell_nodes(ref_cell,iVar17,local_188);
                        if (RVar4 == 0) {
                          lVar7 = (long)ref_cell->node_per;
                          if (0 < lVar7) {
                            lVar13 = 0;
                            bVar25 = false;
                            do {
                              while (bVar25) {
                                lVar13 = lVar13 + 1;
                                bVar25 = true;
                                if (lVar13 == lVar7) goto LAB_001f936f;
                              }
                              piVar1 = local_188 + lVar13;
                              bVar25 = local_1d0->id == ref_node->part[*piVar1];
                              lVar13 = lVar13 + 1;
                            } while (lVar13 != lVar7);
                            if (local_1d0->id == ref_node->part[*piVar1]) goto LAB_001f936f;
                          }
                          uVar5 = ref_cell_remove(ref_cell,iVar17);
                          if (uVar5 != 0) {
                            uVar18 = (ulong)uVar5;
                            pcVar22 = "remove";
                            uVar16 = 0x634;
                            goto LAB_001f8dbf;
                          }
                        }
LAB_001f936f:
                        iVar17 = iVar17 + 1;
                        if (ref_cell->max <= iVar17) {
                          return 0;
                        }
                      } while( true );
                    }
                    uVar18 = (ulong)uVar5;
                    pcVar22 = "g";
                    uVar16 = 0x624;
                  }
                  else {
                    uVar18 = (ulong)uVar5;
                    pcVar22 = "alltoallv parts";
                    uVar16 = 0x620;
                  }
                }
                else {
                  uVar18 = (ulong)uVar5;
                  pcVar22 = "alltoallv c2n";
                  uVar16 = 0x61d;
                }
                goto LAB_001f8dbf;
              }
              pcVar22 = "malloc a_next of REF_INT NULL";
              uVar16 = 0x5fa;
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar16,
         "ref_migrate_shufflin_cell",pcVar22);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_shufflin_cell(REF_NODE ref_node,
                                             REF_CELL ref_cell) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT all_parts[REF_CELL_MAX_SIZE_PER];
  REF_INT nunique;
  REF_INT unique_parts[REF_CELL_MAX_SIZE_PER];
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT part, node, cell, i;
  REF_INT *a_next;
  REF_GLOB *a_c2n, *b_c2n;
  REF_INT *a_parts, *b_parts;
  REF_BOOL need_to_keep;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      all_parts[node] = ref_node_part(ref_node, nodes[node]);
    }
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), all_parts, &nunique,
                            unique_parts),
        "unique");
    for (node = 0; node < nunique; node++) {
      part = unique_parts[node];
      if (ref_mpi_rank(ref_mpi) != part) a_size[part]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_c2n, ref_cell_size_per(ref_cell) * a_total, REF_GLOB);
  ref_malloc(a_parts, ref_cell_size_per(ref_cell) * a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_c2n, ref_cell_size_per(ref_cell) * b_total, REF_GLOB);
  ref_malloc(b_parts, ref_cell_size_per(ref_cell) * b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      all_parts[node] = ref_node_part(ref_node, nodes[node]);
    }
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), all_parts, &nunique,
                            unique_parts),
        "unique");
    for (node = 0; node < nunique; node++) {
      part = unique_parts[node];
      if (ref_mpi_rank(ref_mpi) != part) {
        for (i = 0; i < ref_cell_node_per(ref_cell); i++) {
          a_c2n[i + ref_cell_size_per(ref_cell) * a_next[part]] =
              ref_node_global(ref_node, nodes[i]);
          a_parts[i + ref_cell_size_per(ref_cell) * a_next[part]] =
              ref_node_part(ref_node, nodes[i]);
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          a_c2n[ref_cell_node_per(ref_cell) +
                ref_cell_size_per(ref_cell) * a_next[part]] =
              (REF_GLOB)nodes[ref_cell_node_per(ref_cell)];
          a_parts[ref_cell_node_per(ref_cell) +
                  ref_cell_size_per(ref_cell) * a_next[part]] = REF_EMPTY;
        }
        a_next[part]++;
      }
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_c2n, a_size, b_c2n, b_size,
                        ref_cell_size_per(ref_cell), REF_GLOB_TYPE),
      "alltoallv c2n");
  RSS(ref_mpi_alltoallv(ref_mpi, a_parts, a_size, b_parts, b_size,
                        ref_cell_size_per(ref_cell), REF_INT_TYPE),
      "alltoallv parts");

  RSS(ref_cell_add_many_global(ref_cell, ref_node, b_total, b_c2n, b_parts,
                               ref_mpi_rank(ref_mpi)),
      "g");

  free(a_next);
  free(b_parts);
  free(b_c2n);
  free(a_parts);
  free(a_c2n);
  free(b_size);
  free(a_size);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    need_to_keep = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      need_to_keep = (need_to_keep || (ref_mpi_rank(ref_mpi) ==
                                       ref_node_part(ref_node, nodes[node])));
    }
    if (!need_to_keep) RSS(ref_cell_remove(ref_cell, cell), "remove");
  }

  return REF_SUCCESS;
}